

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O0

bool Option::postProcessProject(QMakeProject *project)

{
  bool bVar1;
  QMakeEvaluator *in_RDI;
  long in_FS_OFFSET;
  QMakeProject *in_stack_fffffffffffff738;
  undefined7 in_stack_fffffffffffff740;
  undefined1 in_stack_fffffffffffff747;
  QMakeEvaluator *variableName;
  ProStringList *in_stack_fffffffffffff760;
  byte local_82a;
  QChar local_81a;
  QString local_818;
  undefined1 local_800 [24];
  undefined1 local_7e8 [2016];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeProject::values
            ((QMakeProject *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
             (ProKey *)in_stack_fffffffffffff738);
  ProStringList::toQStringList(in_stack_fffffffffffff760);
  QList<QString>::operator=
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
             (QList<QString> *)in_stack_fffffffffffff738);
  QList<QString>::~QList((QList<QString> *)0x326a58);
  ProKey::~ProKey((ProKey *)0x326a65);
  variableName = in_RDI;
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeProject::values
            ((QMakeProject *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
             (ProKey *)in_stack_fffffffffffff738);
  ProStringList::toQStringList(in_stack_fffffffffffff760);
  QList<QString>::operator=
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
             (QList<QString> *)in_stack_fffffffffffff738);
  QList<QString>::~QList((QList<QString> *)0x326ac9);
  ProKey::~ProKey((ProKey *)0x326ad6);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeProject::values
            ((QMakeProject *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
             (ProKey *)in_stack_fffffffffffff738);
  ProStringList::toQStringList(in_stack_fffffffffffff760);
  QList<QString>::operator=
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
             (QList<QString> *)in_stack_fffffffffffff738);
  QList<QString>::~QList((QList<QString> *)0x326b3a);
  ProKey::~ProKey((ProKey *)0x326b47);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x326bb8);
  ProString::~ProString((ProString *)0x326bc5);
  ProKey::~ProKey((ProKey *)0x326bd2);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x326c43);
  ProString::~ProString((ProString *)0x326c50);
  ProKey::~ProKey((ProKey *)0x326c5d);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x326cce);
  ProString::~ProString((ProString *)0x326cdb);
  ProKey::~ProKey((ProKey *)0x326ce8);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x326d59);
  ProString::~ProString((ProString *)0x326d66);
  ProKey::~ProKey((ProKey *)0x326d73);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x326de4);
  ProString::~ProString((ProString *)0x326df1);
  ProKey::~ProKey((ProKey *)0x326dfe);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x326e6f);
  ProString::~ProString((ProString *)0x326e7c);
  ProKey::~ProKey((ProKey *)0x326e89);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x326efa);
  ProString::~ProString((ProString *)0x326f07);
  ProKey::~ProKey((ProKey *)0x326f14);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x326f85);
  ProString::~ProString((ProString *)0x326f92);
  ProKey::~ProKey((ProKey *)0x326f9f);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x327010);
  ProString::~ProString((ProString *)0x32701d);
  ProKey::~ProKey((ProKey *)0x32702a);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x32709b);
  ProString::~ProString((ProString *)0x3270a8);
  ProKey::~ProKey((ProKey *)0x3270b5);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x327126);
  ProString::~ProString((ProString *)0x327133);
  ProKey::~ProKey((ProKey *)0x327140);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x3271b7);
  ProString::~ProString((ProString *)0x3271c4);
  ProKey::~ProKey((ProKey *)0x3271d1);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x327248);
  ProString::~ProString((ProString *)0x327255);
  ProKey::~ProKey((ProKey *)0x327262);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (char *)in_stack_fffffffffffff738);
  QMakeEvaluator::first(in_RDI,(ProKey *)variableName);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x3272d9);
  ProString::~ProString((ProString *)0x3272e6);
  ProKey::~ProKey((ProKey *)0x3272f3);
  QMakeEvaluator::dirSep(&in_stack_fffffffffffff738->super_QMakeEvaluator);
  ProString::toQString((ProString *)in_stack_fffffffffffff738);
  QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (QString *)in_stack_fffffffffffff738);
  QString::~QString((QString *)0x32733e);
  ProString::~ProString((ProString *)0x32734b);
  QMakeProject::buildRoot(in_stack_fffffffffffff738);
  bVar1 = QString::isEmpty((QString *)0x32736d);
  local_82a = 0;
  if (!bVar1) {
    QMakeProject::buildRoot(in_stack_fffffffffffff738);
    local_82a = QString::startsWith((QString *)&output_dir,(CaseSensitivity)local_7e8);
    QString::~QString((QString *)0x3273e6);
  }
  QString::~QString((QString *)0x3273f3);
  if ((local_82a & 1) != 0) {
    QMakeProject::buildRoot(in_stack_fffffffffffff738);
    QString::size(&local_818);
    QString::mid((longlong)local_800,0x3bdc70);
    QChar::QChar<char,_true>(&local_81a,'/');
    mkfile::cachefile_depth = QString::count((QChar)(char16_t)local_800,(uint)(ushort)local_81a.ucs)
    ;
    QString::~QString((QString *)0x32747f);
    QString::~QString((QString *)0x32748c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool Option::postProcessProject(QMakeProject *project)
{
    Option::cpp_ext = project->values("QMAKE_EXT_CPP").toQStringList();
    Option::h_ext = project->values("QMAKE_EXT_H").toQStringList();
    Option::c_ext = project->values("QMAKE_EXT_C").toQStringList();
    Option::objc_ext = project->first("QMAKE_EXT_OBJC").toQString();
    Option::objcpp_ext = project->first("QMAKE_EXT_OBJCXX").toQString();
    Option::res_ext = project->first("QMAKE_EXT_RES").toQString();
    Option::pkgcfg_ext = project->first("QMAKE_EXT_PKGCONFIG").toQString();
    Option::libtool_ext = project->first("QMAKE_EXT_LIBTOOL").toQString();
    Option::prl_ext = project->first("QMAKE_EXT_PRL").toQString();
    Option::ui_ext = project->first("QMAKE_EXT_UI").toQString();
    Option::cpp_moc_ext = project->first("QMAKE_EXT_CPP_MOC").toQString();
    Option::lex_ext = project->first("QMAKE_EXT_LEX").toQString();
    Option::yacc_ext = project->first("QMAKE_EXT_YACC").toQString();
    Option::obj_ext = project->first("QMAKE_EXT_OBJ").toQString();
    Option::h_moc_mod = project->first("QMAKE_H_MOD_MOC").toQString();
    Option::lex_mod = project->first("QMAKE_MOD_LEX").toQString();
    Option::yacc_mod = project->first("QMAKE_MOD_YACC").toQString();

    Option::dir_sep = project->dirSep().toQString();

    if (!project->buildRoot().isEmpty() && Option::output_dir.startsWith(project->buildRoot()))
        Option::mkfile::cachefile_depth =
                Option::output_dir.mid(project->buildRoot().size()).count('/');

    return true;
}